

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tetgen.cxx
# Opt level: O2

void __thiscall tetgenmesh::qualitystatistics(tetgenmesh *this)

{
  int iVar1;
  double dVar2;
  double dVar3;
  bool bVar4;
  long lVar5;
  tetrahedron *pppdVar6;
  double (*padVar7) [4];
  double *pdVar8;
  double (*padVar9) [3];
  size_t sVar10;
  int iVar11;
  ulong uVar12;
  long lVar13;
  char *pcVar14;
  ulong uVar15;
  tetgenmesh *this_00;
  unsigned_long *puVar16;
  undefined4 uVar17;
  undefined4 uVar18;
  undefined4 uVar19;
  undefined4 uVar20;
  uint uVar21;
  double __x;
  double dVar22;
  double dVar23;
  double dVar24;
  double dVar25;
  double dVar26;
  double dVar27;
  double __x_00;
  double __x_01;
  double dVar28;
  double local_650;
  double local_628;
  double local_620;
  double local_618;
  double local_610;
  double local_600;
  double local_5f8;
  double N [4] [3];
  double faceangle [3];
  double rhs [4];
  point p [4];
  int indx [4];
  double H [4];
  double D;
  double local_4e8 [12];
  double alldihed [6];
  double local_458 [12];
  unsigned_long aspecttable [16];
  double edgelength [6];
  double V [6] [3];
  unsigned_long dihedangletable [18];
  char sbuf [128];
  double A [4] [4];
  unsigned_long faceangletable [18];
  unsigned_long radiustable [12];
  
  puts("Mesh quality statistics:\n");
  local_458[0] = 0.707;
  local_458[1] = 1.0;
  local_458[2] = 1.1;
  local_458[3] = 1.2;
  local_458[4] = 1.4;
  local_458[5] = 1.6;
  local_458[6] = 1.8;
  local_458[7] = 2.0;
  local_458[8] = 2.5;
  local_458[9] = 3.0;
  local_458[10] = 10.0;
  local_458[0xb] = 0.0;
  local_4e8[0] = 1.5;
  local_4e8[1] = 2.0;
  local_4e8[2] = 2.5;
  local_4e8[3] = 3.0;
  local_4e8[4] = 4.0;
  local_4e8[5] = 6.0;
  local_4e8[6] = 10.0;
  local_4e8[7] = 15.0;
  local_4e8[8] = 25.0;
  local_4e8[9] = 50.0;
  local_4e8[10] = 100.0;
  local_4e8[0xb] = 0.0;
  for (lVar5 = 0; lVar5 != 0xc; lVar5 = lVar5 + 1) {
    radiustable[lVar5] = 0;
  }
  for (lVar5 = 0; lVar5 != 0xc; lVar5 = lVar5 + 1) {
    aspecttable[lVar5] = 0;
  }
  for (lVar5 = 0; lVar5 != 0x12; lVar5 = lVar5 + 1) {
    dihedangletable[lVar5] = 0;
  }
  for (lVar5 = 0; lVar5 != 0x12; lVar5 = lVar5 + 1) {
    faceangletable[lVar5] = 0;
  }
  dVar22 = ((((this->xmax - this->xmin) + this->ymax) - this->ymin) + this->zmax) - this->zmin;
  dVar22 = dVar22 * dVar22;
  iVar1 = this->numelemattrib;
  memorypool::traversalinit(this->tetrahedrons);
  this_00 = this;
  pppdVar6 = tetrahedrontraverse(this);
  local_610 = 1e+16;
  local_618 = 0.0;
  local_5f8 = 180.0;
  local_600 = 0.0;
  dVar25 = 180.0;
  uVar17 = 0;
  uVar18 = 0;
  dVar28 = 0.0;
  dVar26 = 0.0;
  __x_00 = 0.0;
  __x = 0.0;
  __x_01 = dVar22;
LAB_00141aee:
  dVar27 = (double)CONCAT44(uVar18,uVar17);
  local_620 = dVar28;
  local_650 = dVar22;
LAB_00141b1e:
  while( true ) {
    if (pppdVar6 == (tetrahedron *)0x0) {
      if (__x_01 < 0.0) {
        dVar22 = sqrt(__x_01);
        uVar18 = SUB84(dVar22,0);
      }
      else {
        uVar18 = SUB84(SQRT(__x_01),0);
      }
      if (__x < 0.0) {
        dVar22 = sqrt(__x);
        uVar19 = SUB84(dVar22,0);
      }
      else {
        uVar19 = SUB84(SQRT(__x),0);
      }
      printf("  Smallest volume: %16.5g   |  Largest volume: %16.5g\n",SUB84(local_650,0),
             SUB84(local_620,0));
      printf("  Shortest edge:   %16.5g   |  Longest edge:   %16.5g\n",uVar18,uVar19);
      printf("  Smallest asp.ratio: %13.5g   |  Largest asp.ratio: %13.5g\n",SUB84(local_610,0),
             SUB84(local_618,0));
      sprintf(sbuf,"%.17g",uVar17);
      sVar10 = strlen(sbuf);
      if (8 < sVar10) {
        sbuf[8] = '\0';
      }
      printf("  Smallest facangle: %14.5g   |  Largest facangle:       %s\n",SUB84(dVar25,0),sbuf);
      sprintf(sbuf,"%.17g",SUB84(local_600,0));
      sVar10 = strlen(sbuf);
      if (8 < sVar10) {
        sbuf[8] = '\0';
      }
      printf("  Smallest dihedral: %14.5g   |  Largest dihedral:       %s\n\n",SUB84(local_5f8,0),
             sbuf);
      puts("  Aspect ratio histogram:");
      uVar17 = SUB84(local_4e8[0],0);
      printf("         < %-6.6g    :  %8ld      | %6.6g - %-6.6g     :  %8ld\n",uVar17,0,
             0x4024000000000000,aspecttable[0],aspecttable[6]);
      for (lVar5 = 7; lVar5 != 0xb; lVar5 = lVar5 + 1) {
        dVar22 = H[lVar5];
        printf("  %6.6g - %-6.6g    :  %8ld      | %6.6g - %-6.6g     :  %8ld\n",uVar17,
               SUB84(dVar22,0),local_4e8[lVar5 + -1],local_4e8[lVar5],local_458[lVar5 + 6],
               aspecttable[lVar5]);
        uVar17 = SUB84(dVar22,0);
      }
      printf("  %6.6g - %-6.6g    :  %8ld      | %6.6g -            :  %8ld\n",0,0,
             0x4059000000000000,aspecttable[5],aspecttable[0xb]);
      printf("  (A tetrahedron\'s aspect ratio is its longest edge length");
      puts(" divided by its");
      puts("    smallest side height)\n");
      puts("  Face angle histogram:");
      puVar16 = faceangletable;
      uVar15 = 0;
      while (uVar15 != 0x5a) {
        printf("    %3d - %3d degrees:  %8ld      |    %3d - %3d degrees:  %8ld\n",uVar15,
               uVar15 + 10 & 0xffffffff,*puVar16,(ulong)((int)uVar15 + 0x5a),
               (ulong)((int)uVar15 + 100),puVar16[9]);
        puVar16 = puVar16 + 1;
        uVar15 = uVar15 + 10;
      }
      dVar22 = this->minfaceang;
      if ((dVar22 != PI) || (NAN(dVar22) || NAN(PI))) {
        printf("  Minimum input face angle is %g (degree).\n",SUB84((dVar22 / PI) * 180.0,0));
      }
      putchar(10);
      puts("  Dihedral angle histogram:");
      puVar16 = dihedangletable + 2;
      printf("     %3d - %2d degrees:  %8ld      |    %3d - %3d degrees:  %8ld\n",0,5,
             dihedangletable[0],0x50,0x6e,dihedangletable[9]);
      printf("     %3d - %2d degrees:  %8ld      |    %3d - %3d degrees:  %8ld\n",5,10,
             dihedangletable[1],0x6e,0x78,dihedangletable[10]);
      for (lVar5 = -0x32; lVar5 != 0; lVar5 = lVar5 + 10) {
        iVar1 = (int)lVar5;
        printf("     %3d - %2d degrees:  %8ld      |    %3d - %3d degrees:  %8ld\n",
               (ulong)(iVar1 + 0x3c),(ulong)(iVar1 + 0x46),*puVar16,(ulong)(iVar1 + 0xaa),
               (ulong)(iVar1 + 0xb4),puVar16[9]);
        puVar16 = puVar16 + 1;
      }
      printf("     %3d - %2d degrees:  %8ld      |    %3d - %3d degrees:  %8ld\n",0x3c,0x46,
             dihedangletable[7],0xaa,0xaf,dihedangletable[0x10]);
      printf("     %3d - %2d degrees:  %8ld      |    %3d - %3d degrees:  %8ld\n",0x46,0x50,
             dihedangletable[8],0xaf,0xb4,dihedangletable[0x11]);
      dVar22 = this->minfacetdihed;
      if ((dVar22 != PI) || (NAN(dVar22) || NAN(PI))) {
        printf("  Minimum input dihedral angle is %g (degree).\n",SUB84((dVar22 / PI) * 180.0,0));
      }
      putchar(10);
      putchar(10);
      return;
    }
    if (((this->b->convex == 0) ||
        ((double)pppdVar6[(long)this->elemattribindex + (long)iVar1 + -1] != -1.0)) ||
       (NAN((double)pppdVar6[(long)this->elemattribindex + (long)iVar1 + -1]))) break;
    this_00 = this;
    pppdVar6 = tetrahedrontraverse(this);
  }
  for (lVar5 = 4; lVar5 != 8; lVar5 = lVar5 + 1) {
    rhs[lVar5] = (double)pppdVar6[lVar5];
  }
  dVar2 = orient3dfast(this_00,p[1],p[0],p[2],p[3]);
  dVar2 = dVar2 / 6.0;
  tetprismvol(this_00,p[0],p[1],p[2],p[3]);
  for (lVar5 = 0; lVar5 != 3; lVar5 = lVar5 + 1) {
    dihedangletable[lVar5 + -0x12] = (unsigned_long)(p[0][lVar5] - p[3][lVar5]);
  }
  dVar22 = dVar2;
  if (local_650 <= dVar2) {
    dVar22 = local_650;
  }
  for (lVar5 = 0; lVar5 != 3; lVar5 = lVar5 + 1) {
    dihedangletable[lVar5 + -0xf] = (unsigned_long)(p[1][lVar5] - p[3][lVar5]);
  }
  for (lVar5 = 0; lVar5 != 3; lVar5 = lVar5 + 1) {
    dihedangletable[lVar5 + -0xc] = (unsigned_long)(p[2][lVar5] - p[3][lVar5]);
  }
  for (lVar5 = 0; lVar5 != 3; lVar5 = lVar5 + 1) {
    dihedangletable[lVar5 + -9] = (unsigned_long)(p[1][lVar5] - p[0][lVar5]);
  }
  for (lVar5 = 0; lVar5 != 3; lVar5 = lVar5 + 1) {
    dihedangletable[lVar5 + -6] = (unsigned_long)(p[2][lVar5] - p[1][lVar5]);
  }
  for (lVar5 = 0; lVar5 != 3; lVar5 = lVar5 + 1) {
    dihedangletable[lVar5 + -3] = (unsigned_long)(p[0][lVar5] - p[2][lVar5]);
  }
  pdVar8 = V[0] + 2;
  for (lVar5 = 0; lVar5 != 6; lVar5 = lVar5 + 1) {
    edgelength[lVar5] =
         *pdVar8 * *pdVar8 +
         (*(double (*) [3])(pdVar8 + -2))[0] * (*(double (*) [3])(pdVar8 + -2))[0] +
         pdVar8[-1] * pdVar8[-1];
    pdVar8 = pdVar8 + 3;
  }
  lVar5 = 0;
  do {
    uVar18 = SUB84(edgelength[0],0);
    uVar19 = (undefined4)((ulong)edgelength[0] >> 0x20);
    dVar23 = edgelength[0];
    dVar28 = edgelength[0];
    if (lVar5 != 0) {
      if (lVar5 == 6) break;
      dVar28 = edgelength[lVar5];
      uVar18 = SUB84(dVar28,0);
      uVar19 = (undefined4)((ulong)dVar28 >> 0x20);
      dVar23 = dVar28;
      if (dVar26 <= dVar28) {
        dVar23 = dVar26;
      }
      if (dVar28 <= __x_00) {
        dVar28 = __x_00;
      }
    }
    dVar26 = (double)CONCAT44(uVar19,uVar18);
    if ((double)CONCAT44(uVar19,uVar18) <= __x) {
      dVar26 = __x;
    }
    if (__x_01 <= (double)CONCAT44(uVar19,uVar18)) {
      uVar18 = SUB84(__x_01,0);
      uVar19 = (int)((ulong)__x_01 >> 0x20);
    }
    lVar5 = lVar5 + 1;
    __x_01 = (double)CONCAT44(uVar19,uVar18);
    __x = dVar26;
    dVar26 = dVar23;
    __x_00 = dVar28;
  } while( true );
  padVar7 = A;
  padVar9 = V;
  for (lVar5 = 0; lVar5 != 3; lVar5 = lVar5 + 1) {
    for (lVar13 = 0; lVar13 != 3; lVar13 = lVar13 + 1) {
      (*padVar7)[lVar13] = (*padVar9)[lVar13];
    }
    padVar9 = padVar9 + 1;
    padVar7 = padVar7 + 1;
  }
  dVar28 = dVar2;
  if (dVar2 <= local_620) {
    dVar28 = local_620;
  }
  bVar4 = lu_decmp(this_00,A,3,indx,&D,0);
  if (!bVar4) {
    if (0.0 < dVar2) goto LAB_00142078;
    pcVar14 = "degenerated";
    if (dVar2 < 0.0) {
      pcVar14 = "inverted";
    }
    lVar5 = (long)this->pointmarkindex;
    printf("  !! Warning:  A %s tet (%d,%d,%d,%d).\n",pcVar14,
           (ulong)*(uint *)((long)p[0] + lVar5 * 4),(ulong)*(uint *)((long)p[1] + lVar5 * 4),
           (ulong)*(uint *)((long)p[2] + lVar5 * 4));
    this_00 = this;
    pppdVar6 = tetrahedrontraverse(this);
    local_620 = dVar28;
    local_650 = dVar22;
    goto LAB_00141b1e;
  }
  padVar9 = N;
  for (lVar5 = 0; lVar5 != 3; lVar5 = lVar5 + 1) {
    for (lVar13 = 0; lVar13 != 3; lVar13 = lVar13 + 1) {
      rhs[lVar13] = 0.0;
    }
    rhs[lVar5] = 1.0;
    lu_solve(this_00,A,3,indx,rhs,0);
    for (lVar13 = 0; lVar13 != 3; lVar13 = lVar13 + 1) {
      (*padVar9)[lVar13] = rhs[lVar13];
    }
    padVar9 = padVar9 + 1;
  }
  for (lVar5 = -0x18; lVar5 != 0; lVar5 = lVar5 + 8) {
    *(double *)((long)faceangle + lVar5) =
         (-*(double *)((long)N[1] + lVar5) - *(double *)((long)N[2] + lVar5)) -
         *(double *)((long)N[3] + lVar5);
  }
  pdVar8 = V[0] + 2;
  for (lVar5 = 0; lVar5 != 3; lVar5 = lVar5 + 1) {
    rhs[lVar5] = (*pdVar8 * *pdVar8 +
                 (*(double (*) [3])(pdVar8 + -2))[0] * (*(double (*) [3])(pdVar8 + -2))[0] +
                 pdVar8[-1] * pdVar8[-1]) * 0.5;
    pdVar8 = pdVar8 + 3;
  }
  lu_solve(this_00,A,3,indx,rhs,0);
  dVar2 = rhs[1] * rhs[1];
  dVar24 = rhs[0] * rhs[0];
  dVar23 = rhs[2] * rhs[2];
  padVar9 = N;
  for (lVar5 = 0; lVar5 != 4; lVar5 = lVar5 + 1) {
    dVar3 = SQRT(N[lVar5][2] * N[lVar5][2] + N[lVar5][0] * N[lVar5][0] + N[lVar5][1] * N[lVar5][1]);
    H[lVar5] = dVar3;
    for (lVar13 = 0; lVar13 != 3; lVar13 = lVar13 + 1) {
      (*padVar9)[lVar13] = (*padVar9)[lVar13] / dVar3;
    }
    padVar9 = padVar9 + 1;
  }
  uVar17 = SUB84(H[0],0);
  uVar18 = (int)((ulong)H[0] >> 0x20);
  for (lVar5 = 1; lVar5 != 4; lVar5 = lVar5 + 1) {
    dVar3 = H[lVar5];
    uVar19 = SUB84(dVar3,0);
    uVar20 = (int)((ulong)dVar3 >> 0x20);
    if (dVar3 <= (double)CONCAT44(uVar18,uVar17)) {
      uVar19 = uVar17;
      uVar20 = uVar18;
    }
    uVar17 = uVar19;
    uVar18 = uVar20;
  }
  local_628 = (double)CONCAT44(uVar18,uVar17);
  dVar2 = SQRT(dVar23 + dVar24 + dVar2);
LAB_001421d5:
  pdVar8 = N[1] + 2;
  for (lVar5 = 0; lVar5 != 3; lVar5 = lVar5 + 1) {
    dVar23 = N[0][2] * *pdVar8 +
             N[0][0] * (*(double (*) [3])(pdVar8 + -2))[0] + N[0][1] * pdVar8[-1];
    uVar17 = 0;
    uVar21 = 0xbff00000;
    if (dVar23 <= 1.0) {
      if (-1.0 <= dVar23) {
        uVar21 = (uint)((ulong)dVar23 >> 0x20) ^ 0x80000000;
        uVar17 = SUB84(dVar23,0);
      }
      else {
        uVar17 = 0;
        uVar21 = 0x3ff00000;
      }
    }
    dVar23 = acos((double)CONCAT44(uVar21,uVar17));
    alldihed[lVar5] = (dVar23 / PI) * 180.0;
    pdVar8 = pdVar8 + 3;
  }
  pdVar8 = N[2] + 2;
  for (lVar5 = 3; lVar5 != 5; lVar5 = lVar5 + 1) {
    dVar23 = N[1][2] * *pdVar8 +
             N[1][0] * (*(double (*) [3])(pdVar8 + -2))[0] + N[1][1] * pdVar8[-1];
    uVar17 = 0;
    uVar21 = 0xbff00000;
    if (dVar23 <= 1.0) {
      if (-1.0 <= dVar23) {
        uVar21 = (uint)((ulong)dVar23 >> 0x20) ^ 0x80000000;
        uVar17 = SUB84(dVar23,0);
      }
      else {
        uVar17 = 0;
        uVar21 = 0x3ff00000;
      }
    }
    dVar23 = acos((double)CONCAT44(uVar21,uVar17));
    alldihed[lVar5] = (dVar23 / PI) * 180.0;
    pdVar8 = pdVar8 + 3;
  }
  dVar23 = N[2][2] * N[3][2] + N[2][0] * N[3][0] + N[2][1] * N[3][1];
  uVar17 = 0;
  uVar21 = 0xbff00000;
  if (dVar23 <= 1.0) {
    if (-1.0 <= dVar23) {
      uVar21 = (uint)((ulong)dVar23 >> 0x20) ^ 0x80000000;
      uVar17 = SUB84(dVar23,0);
    }
    else {
      uVar17 = 0;
      uVar21 = 0x3ff00000;
    }
  }
  dVar23 = acos((double)CONCAT44(uVar21,uVar17));
  alldihed[5] = (dVar23 / PI) * 180.0;
  lVar5 = 0;
  do {
    uVar17 = SUB84(alldihed[0],0);
    uVar18 = (undefined4)((ulong)alldihed[0] >> 0x20);
    if (lVar5 != 0) {
      if (lVar5 == 6) goto LAB_001424c1;
      uVar17 = SUB84(alldihed[lVar5],0);
      uVar18 = (undefined4)((ulong)alldihed[lVar5] >> 0x20);
    }
    iVar11 = 0;
    if ((((5.0 < (double)CONCAT44(uVar18,uVar17) || (double)CONCAT44(uVar18,uVar17) == 5.0) &&
         (((double)CONCAT44(uVar18,uVar17) < 5.0 ||
          (iVar11 = 1,
          10.0 < (double)CONCAT44(uVar18,uVar17) || (double)CONCAT44(uVar18,uVar17) == 10.0)))) &&
        (((double)CONCAT44(uVar18,uVar17) < 80.0 ||
         (iVar11 = 9,
         110.0 < (double)CONCAT44(uVar18,uVar17) || (double)CONCAT44(uVar18,uVar17) == 110.0)))) &&
       ((((double)CONCAT44(uVar18,uVar17) < 170.0 ||
         (iVar11 = 0x10,
         175.0 < (double)CONCAT44(uVar18,uVar17) || (double)CONCAT44(uVar18,uVar17) == 175.0)) &&
        (iVar11 = 0x11, (double)CONCAT44(uVar18,uVar17) < 175.0)))) {
      iVar11 = (int)((double)CONCAT44(uVar18,uVar17) / 10.0);
      if (80.0 < (double)CONCAT44(uVar18,uVar17) || (double)CONCAT44(uVar18,uVar17) == 80.0) {
        iVar11 = iVar11 + -1;
      }
      else {
        iVar11 = iVar11 + 1;
      }
    }
    dVar23 = (double)CONCAT44(uVar18,uVar17);
    if (local_5f8 <= (double)CONCAT44(uVar18,uVar17)) {
      dVar23 = local_5f8;
    }
    dihedangletable[iVar11] = dihedangletable[iVar11] + 1;
    if ((double)CONCAT44(uVar18,uVar17) <= local_600) {
      uVar17 = SUB84(local_600,0);
      uVar18 = (undefined4)((ulong)local_600 >> 0x20);
    }
    lVar5 = lVar5 + 1;
    local_600 = (double)CONCAT44(uVar18,uVar17);
    local_5f8 = dVar23;
  } while( true );
LAB_00142078:
  facenormal(this,p[2],p[1],p[3],N[0],1,(double *)0x0);
  facenormal(this,p[0],p[2],p[3],N[1],1,(double *)0x0);
  facenormal(this,p[1],p[0],p[3],N[2],1,(double *)0x0);
  this_00 = this;
  facenormal(this,p[0],p[1],p[2],N[3],1,(double *)0x0);
  padVar9 = N;
  for (lVar5 = 0; lVar5 != 4; lVar5 = lVar5 + 1) {
    dVar23 = SQRT(N[lVar5][2] * N[lVar5][2] + N[lVar5][0] * N[lVar5][0] + N[lVar5][1] * N[lVar5][1])
    ;
    H[lVar5] = dVar23;
    for (lVar13 = 0; lVar13 != 3; lVar13 = lVar13 + 1) {
      (*padVar9)[lVar13] = (*padVar9)[lVar13] / dVar23;
    }
    padVar9 = padVar9 + 1;
  }
  local_628 = H[0] / dVar2;
  for (lVar5 = 1; lVar5 != 4; lVar5 = lVar5 + 1) {
    dVar23 = H[lVar5] / dVar2;
    if (H[lVar5] / dVar2 <= local_628) {
      dVar23 = local_628;
    }
    local_628 = dVar23;
  }
  if (__x_00 < 0.0) {
    dVar2 = sqrt(__x_00);
  }
  else {
    dVar2 = SQRT(__x_00);
  }
  dVar2 = dVar2 * 0.5;
  goto LAB_001421d5;
LAB_001424c1:
  for (lVar5 = 0; lVar5 != 4; lVar5 = lVar5 + 1) {
    if ((((tetrahedron *)((ulong)pppdVar6[lVar5] & 0xfffffffffffffff0))[7] ==
         (tetrahedron)this->dummypoint) ||
       (pppdVar6 < (tetrahedron *)((ulong)pppdVar6[lVar5] & 0xfffffffffffffff0))) {
      p[0] = (point)pppdVar6[orgpivot[lVar5]];
      p[1] = (point)pppdVar6[destpivot[lVar5]];
      p[2] = (point)pppdVar6[apexpivot[lVar5]];
      dVar23 = interiorangle(this_00,p[0],p[1],p[2],(double *)0x0);
      faceangle[0] = dVar23;
      faceangle[1] = interiorangle(this_00,p[1],p[2],p[0],(double *)0x0);
      faceangle[2] = PI - (dVar23 + faceangle[1]);
      for (lVar13 = 0; lVar13 != 3; lVar13 = lVar13 + 1) {
        faceangle[lVar13] = (faceangle[lVar13] * 180.0) / PI;
      }
      lVar13 = 0;
      do {
        uVar17 = SUB84(faceangle[0],0);
        uVar18 = (undefined4)((ulong)faceangle[0] >> 0x20);
        if (lVar13 != 0) {
          if (lVar13 == 3) break;
          uVar17 = SUB84(faceangle[lVar13],0);
          uVar18 = (undefined4)((ulong)faceangle[lVar13] >> 0x20);
        }
        dVar23 = (double)CONCAT44(uVar18,uVar17);
        if (dVar25 <= (double)CONCAT44(uVar18,uVar17)) {
          dVar23 = dVar25;
        }
        faceangletable[(int)((double)CONCAT44(uVar18,uVar17) / 10.0)] =
             faceangletable[(int)((double)CONCAT44(uVar18,uVar17) / 10.0)] + 1;
        dVar24 = (double)CONCAT44(uVar18,uVar17);
        if ((double)CONCAT44(uVar18,uVar17) <= dVar27) {
          dVar24 = dVar27;
        }
        lVar13 = lVar13 + 1;
        dVar25 = dVar23;
        dVar27 = dVar24;
      } while( true );
    }
  }
  if (dVar26 < 0.0) {
    dVar23 = sqrt(dVar26);
  }
  else {
    dVar23 = SQRT(dVar26);
  }
  if (__x_00 < 0.0) {
    dVar24 = sqrt(__x_00);
  }
  else {
    dVar24 = SQRT(__x_00);
  }
  local_628 = local_628 * dVar24;
  uVar15 = 0;
  do {
    uVar12 = uVar15;
    if (10 < uVar12) break;
    uVar15 = uVar12 + 1;
  } while (local_4e8[uVar12] <= local_628 && local_628 != local_4e8[uVar12]);
  dVar24 = local_628;
  if (local_610 <= local_628) {
    dVar24 = local_610;
  }
  aspecttable[uVar12] = aspecttable[uVar12] + 1;
  uVar15 = 0;
  do {
    uVar12 = uVar15;
    if (10 < uVar12) break;
    uVar15 = uVar12 + 1;
  } while (local_458[uVar12] <= dVar2 / dVar23 && dVar2 / dVar23 != local_458[uVar12]);
  if (local_628 <= local_618) {
    local_628 = local_618;
  }
  faceangletable[uVar12 + 0x12] = faceangletable[uVar12 + 0x12] + 1;
  this_00 = this;
  pppdVar6 = tetrahedrontraverse(this);
  uVar17 = SUB84(dVar27,0);
  uVar18 = (undefined4)((ulong)dVar27 >> 0x20);
  local_618 = local_628;
  local_610 = dVar24;
  goto LAB_00141aee;
}

Assistant:

void tetgenmesh::qualitystatistics()
{
  triface tetloop, neightet;
  point p[4];
  char sbuf[128];
  REAL radiusratiotable[12];
  REAL aspectratiotable[12];
  REAL A[4][4], rhs[4], D;
  REAL V[6][3], N[4][3], H[4]; // edge-vectors, face-normals, face-heights.
  REAL edgelength[6], alldihed[6], faceangle[3];
  REAL shortest, longest;
  REAL smallestvolume, biggestvolume;
  REAL smallestratio, biggestratio;
  REAL smallestdiangle, biggestdiangle;
  REAL smallestfaangle, biggestfaangle;
  REAL total_tet_vol, total_tetprism_vol;
  REAL tetvol, minaltitude;
  REAL cirradius, minheightinv; // insradius;
  REAL shortlen, longlen;
  REAL tetaspect, tetradius;
  REAL smalldiangle, bigdiangle;
  REAL smallfaangle, bigfaangle;
  unsigned long radiustable[12];
  unsigned long aspecttable[16];
  unsigned long dihedangletable[18];
  unsigned long faceangletable[18];
  int indx[4];
  int radiusindex;
  int aspectindex;
  int tendegree;
  int i, j;

  printf("Mesh quality statistics:\n\n");

  shortlen = longlen = 0.0;
  smalldiangle = bigdiangle = 0.0;
  total_tet_vol = 0.0;
  total_tetprism_vol = 0.0;

  radiusratiotable[0]  =    0.707;    radiusratiotable[1]  =     1.0;
  radiusratiotable[2]  =      1.1;    radiusratiotable[3]  =     1.2;
  radiusratiotable[4]  =      1.4;    radiusratiotable[5]  =     1.6;
  radiusratiotable[6]  =      1.8;    radiusratiotable[7]  =     2.0;
  radiusratiotable[8]  =      2.5;    radiusratiotable[9]  =     3.0;
  radiusratiotable[10] =     10.0;    radiusratiotable[11] =     0.0;

  aspectratiotable[0]  =      1.5;    aspectratiotable[1]  =     2.0;
  aspectratiotable[2]  =      2.5;    aspectratiotable[3]  =     3.0;
  aspectratiotable[4]  =      4.0;    aspectratiotable[5]  =     6.0;
  aspectratiotable[6]  =     10.0;    aspectratiotable[7]  =    15.0;
  aspectratiotable[8]  =     25.0;    aspectratiotable[9]  =    50.0;
  aspectratiotable[10] =    100.0;    aspectratiotable[11] =     0.0;
  
  for (i = 0; i < 12; i++) radiustable[i] = 0l;
  for (i = 0; i < 12; i++) aspecttable[i] = 0l;
  for (i = 0; i < 18; i++) dihedangletable[i] = 0l;
  for (i = 0; i < 18; i++) faceangletable[i] = 0l;

  minaltitude = xmax - xmin + ymax - ymin + zmax - zmin;
  minaltitude = minaltitude * minaltitude;
  shortest = minaltitude;
  longest = 0.0;
  smallestvolume = minaltitude;
  biggestvolume = 0.0;
  smallestratio = 1e+16; // minaltitude;
  biggestratio = 0.0;
  smallestdiangle = smallestfaangle = 180.0;
  biggestdiangle = biggestfaangle = 0.0;


  int attrnum = numelemattrib - 1;

  // Loop all elements, calculate quality parameters for each element.
  tetrahedrons->traversalinit();
  tetloop.tet = tetrahedrontraverse();
  while (tetloop.tet != (tetrahedron *) NULL) {

    if (b->convex) {
      // Skip tets in the exterior.
      if (elemattribute(tetloop.tet, attrnum) == -1.0) {
        tetloop.tet = tetrahedrontraverse();
        continue;
      }
    }

    // Get four vertices: p0, p1, p2, p3.
    for (i = 0; i < 4; i++) p[i] = (point) tetloop.tet[4 + i];

    // Get the tet volume.
    tetvol = orient3dfast(p[1], p[0], p[2], p[3]) / 6.0;
    total_tet_vol += tetvol;
    total_tetprism_vol += tetprismvol(p[0], p[1], p[2], p[3]);

    // Calculate the largest and smallest volume.
    if (tetvol < smallestvolume) {
      smallestvolume = tetvol;
    } 
    if (tetvol > biggestvolume) {
      biggestvolume = tetvol;
    }

    // Set the edge vectors: V[0], ..., V[5]
    for (i = 0; i < 3; i++) V[0][i] = p[0][i] - p[3][i]; // V[0]: p3->p0.
    for (i = 0; i < 3; i++) V[1][i] = p[1][i] - p[3][i]; // V[1]: p3->p1.
    for (i = 0; i < 3; i++) V[2][i] = p[2][i] - p[3][i]; // V[2]: p3->p2.
    for (i = 0; i < 3; i++) V[3][i] = p[1][i] - p[0][i]; // V[3]: p0->p1.
    for (i = 0; i < 3; i++) V[4][i] = p[2][i] - p[1][i]; // V[4]: p1->p2.
    for (i = 0; i < 3; i++) V[5][i] = p[0][i] - p[2][i]; // V[5]: p2->p0.

    // Get the squares of the edge lengths.
    for (i = 0; i < 6; i++) edgelength[i] = dot(V[i], V[i]);

    // Calculate the longest and shortest edge length.
    for (i = 0; i < 6; i++) {
      if (i == 0) {
        shortlen = longlen = edgelength[i];
      } else {
        shortlen = edgelength[i] < shortlen ? edgelength[i] : shortlen;
        longlen  = edgelength[i] > longlen  ? edgelength[i] : longlen;
      }
      if (edgelength[i] > longest) {
        longest = edgelength[i];
      } 
      if (edgelength[i] < shortest) {
        shortest = edgelength[i];
      }
    }

    // Set the matrix A = [V[0], V[1], V[2]]^T.
    for (j = 0; j < 3; j++) {
      for (i = 0; i < 3; i++) A[j][i] = V[j][i];
    }

    // Decompose A just once.
    if (lu_decmp(A, 3, indx, &D, 0)) {   
      // Get the three faces normals.
      for (j = 0; j < 3; j++) {
        for (i = 0; i < 3; i++) rhs[i] = 0.0;
        rhs[j] = 1.0;  // Positive means the inside direction
        lu_solve(A, 3, indx, rhs, 0);
        for (i = 0; i < 3; i++) N[j][i] = rhs[i];
      }
      // Get the fourth face normal by summing up the first three.
      for (i = 0; i < 3; i++) N[3][i] = - N[0][i] - N[1][i] - N[2][i];
      // Get the radius of the circumsphere.
      for (i = 0; i < 3; i++) rhs[i] = 0.5 * dot(V[i], V[i]);
      lu_solve(A, 3, indx, rhs, 0);
      cirradius = sqrt(dot(rhs, rhs));
      // Normalize the face normals.
      for (i = 0; i < 4; i++) {
        // H[i] is the inverse of height of its corresponding face.
        H[i] = sqrt(dot(N[i], N[i]));
        for (j = 0; j < 3; j++) N[i][j] /= H[i];
      }
      // Get the radius of the inscribed sphere.
      // insradius = 1.0 / (H[0] + H[1] + H[2] + H[3]);
      // Get the biggest H[i] (corresponding to the smallest height).
      minheightinv = H[0];
      for (i = 1; i < 4; i++) {
        if (H[i] > minheightinv) minheightinv = H[i];
      }
    } else {
      // A nearly degenerated tet.
      if (tetvol <= 0.0) {
        printf("  !! Warning:  A %s tet (%d,%d,%d,%d).\n", 
               tetvol < 0 ? "inverted" : "degenerated", pointmark(p[0]),
               pointmark(p[1]), pointmark(p[2]), pointmark(p[3]));
        // Skip it.        
        tetloop.tet = tetrahedrontraverse();
        continue;
      }
      // Calculate the four face normals.
      facenormal(p[2], p[1], p[3], N[0], 1, NULL);
      facenormal(p[0], p[2], p[3], N[1], 1, NULL);
      facenormal(p[1], p[0], p[3], N[2], 1, NULL);
      facenormal(p[0], p[1], p[2], N[3], 1, NULL);
      // Normalize the face normals.
      for (i = 0; i < 4; i++) {
        // H[i] is the twice of the area of the face.
        H[i] = sqrt(dot(N[i], N[i]));
        for (j = 0; j < 3; j++) N[i][j] /= H[i];
      }
      // Get the biggest H[i] / tetvol (corresponding to the smallest height).
      minheightinv = (H[0] / tetvol);
      for (i = 1; i < 4; i++) {
        if ((H[i] / tetvol) > minheightinv) minheightinv = (H[i] / tetvol);
      }
      // Let the circumradius to be the half of its longest edge length.
      cirradius = 0.5 * sqrt(longlen);
    }

    // Get the dihedrals (in degree) at each edges.
    j = 0;
    for (i = 1; i < 4; i++) {
      alldihed[j] = -dot(N[0], N[i]); // Edge cd, bd, bc.
      if (alldihed[j] < -1.0) alldihed[j] = -1; // Rounding.
      else if (alldihed[j] > 1.0) alldihed[j] = 1;
      alldihed[j] = acos(alldihed[j]) / PI * 180.0;
      j++;
    }
    for (i = 2; i < 4; i++) {
      alldihed[j] = -dot(N[1], N[i]); // Edge ad, ac.
      if (alldihed[j] < -1.0) alldihed[j] = -1; // Rounding.
      else if (alldihed[j] > 1.0) alldihed[j] = 1;
      alldihed[j] = acos(alldihed[j]) / PI * 180.0;
      j++;
    }
    alldihed[j] = -dot(N[2], N[3]); // Edge ab.
    if (alldihed[j] < -1.0) alldihed[j] = -1; // Rounding.
    else if (alldihed[j] > 1.0) alldihed[j] = 1;
    alldihed[j] = acos(alldihed[j]) / PI * 180.0;

    // Calculate the largest and smallest dihedral angles.
    for (i = 0; i < 6; i++) {
      if (i == 0) {
        smalldiangle = bigdiangle = alldihed[i];
      } else {
        smalldiangle = alldihed[i] < smalldiangle ? alldihed[i] : smalldiangle;
        bigdiangle = alldihed[i] > bigdiangle ? alldihed[i] : bigdiangle;
      }
      if (alldihed[i] < smallestdiangle) {
        smallestdiangle = alldihed[i];
      } 
      if (alldihed[i] > biggestdiangle) {
        biggestdiangle = alldihed[i];
      }
      // Accumulate the corresponding number in the dihedral angle histogram.
      if (alldihed[i] < 5.0) {
        tendegree = 0;
      } else if (alldihed[i] >= 5.0 && alldihed[i] < 10.0) {
        tendegree = 1;
      } else if (alldihed[i] >= 80.0 && alldihed[i] < 110.0) {
        tendegree = 9; // Angles between 80 to 110 degree are in one entry.
      } else if (alldihed[i] >= 170.0 && alldihed[i] < 175.0) {
        tendegree = 16;
      } else if (alldihed[i] >= 175.0) {
        tendegree = 17;
      } else {
        tendegree = (int) (alldihed[i] / 10.);
        if (alldihed[i] < 80.0) {
          tendegree++;  // In the left column.
        } else {
          tendegree--;  // In the right column.
        }
      }
      dihedangletable[tendegree]++;
    }



    // Calculate the largest and smallest face angles.
    for (tetloop.ver = 0; tetloop.ver < 4; tetloop.ver++) {
      fsym(tetloop, neightet);
      // Only do the calulation once for a face.
      if (((point) neightet.tet[7] == dummypoint) || 
          (tetloop.tet < neightet.tet)) {
        p[0] = org(tetloop);
        p[1] = dest(tetloop);
        p[2] = apex(tetloop);
        faceangle[0] = interiorangle(p[0], p[1], p[2], NULL);
        faceangle[1] = interiorangle(p[1], p[2], p[0], NULL);
        faceangle[2] = PI - (faceangle[0] + faceangle[1]);
        // Translate angles into degrees.
        for (i = 0; i < 3; i++) {
          faceangle[i] = (faceangle[i] * 180.0) / PI;
        }
        // Calculate the largest and smallest face angles.
        for (i = 0; i < 3; i++) {
          if (i == 0) {
            smallfaangle = bigfaangle = faceangle[i];
          } else {
            smallfaangle = faceangle[i] < smallfaangle ? 
              faceangle[i] : smallfaangle;
            bigfaangle = faceangle[i] > bigfaangle ? faceangle[i] : bigfaangle;
          }
          if (faceangle[i] < smallestfaangle) {
            smallestfaangle = faceangle[i];
          } 
          if (faceangle[i] > biggestfaangle) {
            biggestfaangle = faceangle[i];
          }
          tendegree = (int) (faceangle[i] / 10.);
          faceangletable[tendegree]++;
        }
      }
    }

    // Calculate aspect ratio and radius-edge ratio for this element.
    tetradius = cirradius / sqrt(shortlen);
    // tetaspect = sqrt(longlen) / (2.0 * insradius);
    tetaspect = sqrt(longlen) * minheightinv;
    // Remember the largest and smallest aspect ratio.
    if (tetaspect < smallestratio) {
      smallestratio = tetaspect;
    } 
    if (tetaspect > biggestratio) {
      biggestratio = tetaspect;
    }
    // Accumulate the corresponding number in the aspect ratio histogram.
    aspectindex = 0;
    while ((tetaspect > aspectratiotable[aspectindex]) && (aspectindex < 11)) {
      aspectindex++;
    }
    aspecttable[aspectindex]++;
    radiusindex = 0;
    while ((tetradius > radiusratiotable[radiusindex]) && (radiusindex < 11)) {
      radiusindex++;
    }
    radiustable[radiusindex]++;

    tetloop.tet = tetrahedrontraverse();
  }

  shortest = sqrt(shortest);
  longest = sqrt(longest);
  minaltitude = sqrt(minaltitude);

  printf("  Smallest volume: %16.5g   |  Largest volume: %16.5g\n",
         smallestvolume, biggestvolume);
  printf("  Shortest edge:   %16.5g   |  Longest edge:   %16.5g\n",
         shortest, longest);
  printf("  Smallest asp.ratio: %13.5g   |  Largest asp.ratio: %13.5g\n",
         smallestratio, biggestratio);
  sprintf(sbuf, "%.17g", biggestfaangle);
  if (strlen(sbuf) > 8) {
    sbuf[8] = '\0';
  }
  printf("  Smallest facangle: %14.5g   |  Largest facangle:       %s\n",
         smallestfaangle, sbuf);
  sprintf(sbuf, "%.17g", biggestdiangle);
  if (strlen(sbuf) > 8) {
    sbuf[8] = '\0';
  }
  printf("  Smallest dihedral: %14.5g   |  Largest dihedral:       %s\n\n",
         smallestdiangle, sbuf);

  printf("  Aspect ratio histogram:\n");
  printf("         < %-6.6g    :  %8ld      | %6.6g - %-6.6g     :  %8ld\n",
         aspectratiotable[0], aspecttable[0], aspectratiotable[5],
         aspectratiotable[6], aspecttable[6]);
  for (i = 1; i < 5; i++) {
    printf("  %6.6g - %-6.6g    :  %8ld      | %6.6g - %-6.6g     :  %8ld\n",
           aspectratiotable[i - 1], aspectratiotable[i], aspecttable[i],
           aspectratiotable[i + 5], aspectratiotable[i + 6],
           aspecttable[i + 6]);
  }
  printf("  %6.6g - %-6.6g    :  %8ld      | %6.6g -            :  %8ld\n",
         aspectratiotable[4], aspectratiotable[5], aspecttable[5],
         aspectratiotable[10], aspecttable[11]);
  printf("  (A tetrahedron's aspect ratio is its longest edge length");
  printf(" divided by its\n");
  printf("    smallest side height)\n\n");

  printf("  Face angle histogram:\n");
  for (i = 0; i < 9; i++) {
    printf("    %3d - %3d degrees:  %8ld      |    %3d - %3d degrees:  %8ld\n",
           i * 10, i * 10 + 10, faceangletable[i],
           i * 10 + 90, i * 10 + 100, faceangletable[i + 9]);
  }
  if (minfaceang != PI) {
    printf("  Minimum input face angle is %g (degree).\n",
           minfaceang / PI * 180.0);
  }
  printf("\n");

  printf("  Dihedral angle histogram:\n");
  // Print the three two rows:
  printf("     %3d - %2d degrees:  %8ld      |    %3d - %3d degrees:  %8ld\n",
         0, 5, dihedangletable[0], 80, 110, dihedangletable[9]);
  printf("     %3d - %2d degrees:  %8ld      |    %3d - %3d degrees:  %8ld\n",
         5, 10, dihedangletable[1], 110, 120, dihedangletable[10]);
  // Print the third to seventh rows.
  for (i = 2; i < 7; i++) {
    printf("     %3d - %2d degrees:  %8ld      |    %3d - %3d degrees:  %8ld\n",
           (i - 1) * 10, (i - 1) * 10 + 10, dihedangletable[i],
           (i - 1) * 10 + 110, (i - 1) * 10 + 120, dihedangletable[i + 9]);
  }
  // Print the last two rows.
  printf("     %3d - %2d degrees:  %8ld      |    %3d - %3d degrees:  %8ld\n",
         60, 70, dihedangletable[7], 170, 175, dihedangletable[16]);
  printf("     %3d - %2d degrees:  %8ld      |    %3d - %3d degrees:  %8ld\n",
         70, 80, dihedangletable[8], 175, 180, dihedangletable[17]);
  if (minfacetdihed != PI) {
    printf("  Minimum input dihedral angle is %g (degree).\n",
           minfacetdihed / PI * 180.0);
  }
  printf("\n");

  printf("\n");
}